

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

wchar_t project_player_handler_SHARD(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  
  _Var1 = player_resists(player,L'\b');
  p = player;
  if (_Var1) {
    msg("You resist the effect!");
  }
  else {
    uVar2 = Rand_div(context->dam);
    player_inc_timed(p,L'\b',uVar2 + L'\x01',true,true,false);
  }
  return L'\0';
}

Assistant:

static int project_player_handler_SHARD(project_player_handler_context_t *context)
{
	if (player_resists(player, ELEM_SHARD)) {
		msg("You resist the effect!");
		return 0;
	}

	/* Cuts */
	(void)player_inc_timed(player, TMD_CUT, randint1(context->dam), true,
		true, false);
	return 0;
}